

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_runtime_type.h
# Opt level: O2

int density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(Struct_*)>::
    Impl<int_(Struct::*)()>::align_invoke_destroy_impl(long param_1,Struct *param_2)

{
  type tVar1;
  Struct *local_8;
  
  local_8 = param_2;
  tVar1 = invoke<int(density_tests::FunctionQueueSamples<(density::function_type_erasure)1>::func_queue_put_samples(std::ostream&)::Struct::*&)(),density_tests::FunctionQueueSamples<(density::function_type_erasure)1>::func_queue_put_samples(std::ostream&)::Struct*>
                    ((offset_in_Struct_to_subr *)(param_1 + 7U & 0xfffffffffffffff8),&local_8);
  return tVar1;
}

Assistant:

static RET_VAL
                  align_invoke_destroy_impl(std::false_type, void * i_dest, PARAMS... i_params)
                {
                    auto const aligned_dest =
                      static_cast<ACTUAL_TYPE *>(address_upper_align(i_dest, alignof(ACTUAL_TYPE)));
                    auto && ret =
                      density::detail::invoke(*aligned_dest, std::forward<PARAMS>(i_params)...);
                    aligned_dest->ACTUAL_TYPE::~ACTUAL_TYPE();
                    return ret;
                }